

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.cpp
# Opt level: O3

void __thiscall
cbtGImpactMeshShapePart::processAllTrianglesRay
          (cbtGImpactMeshShapePart *this,cbtTriangleCallback *callback,cbtVector3 *rayFrom,
          cbtVector3 *rayTo)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  undefined4 extraout_var;
  long lVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  cbtAlignedObjectArray<int> collided;
  cbtPrimitiveTriangle triangle;
  cbtAlignedObjectArray<int> cStack_a8;
  cbtVector3 local_88;
  undefined1 local_78 [64];
  undefined4 local_38;
  
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1c])();
  cStack_a8.m_ownsMemory = true;
  cStack_a8.m_data = (int *)0x0;
  cStack_a8.m_size = 0;
  cStack_a8.m_capacity = 0;
  fVar8 = rayTo->m_floats[2] - rayFrom->m_floats[2];
  auVar12._4_8_ = SUB128(ZEXT812(0),4);
  auVar12._0_4_ = fVar8;
  auVar12._12_4_ = 0;
  uVar1 = vmovlps_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)rayTo->m_floats;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)rayFrom->m_floats;
  auVar13 = vsubps_avx(auVar13,auVar16);
  fVar4 = auVar13._0_4_;
  auVar17._0_4_ = fVar4 * fVar4;
  fVar5 = auVar13._4_4_;
  auVar17._4_4_ = fVar5 * fVar5;
  fVar6 = auVar13._8_4_;
  auVar17._8_4_ = fVar6 * fVar6;
  fVar7 = auVar13._12_4_;
  auVar17._12_4_ = fVar7 * fVar7;
  auVar12 = vmovshdup_avx(auVar17);
  auVar12 = vfmadd231ss_fma(auVar12,auVar13,auVar13);
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
  auVar12 = vsqrtss_avx(auVar12,auVar12);
  fVar15 = 1.0 / auVar12._0_4_;
  auVar14._0_4_ = fVar4 * fVar15;
  auVar14._4_4_ = fVar5 * fVar15;
  auVar14._8_4_ = fVar6 * fVar15;
  auVar14._12_4_ = fVar7 * fVar15;
  local_88.m_floats._0_8_ = vmovlps_avx(auVar14);
  local_88.m_floats[3] = (cbtScalar)((ulong)uVar1 >> 0x20);
  local_88.m_floats[2] = fVar8 * fVar15;
  cbtGImpactQuantizedBvh::rayQuery
            (&(this->super_cbtGImpactShapeInterface).m_box_set,&local_88,rayFrom,&cStack_a8);
  lVar10 = (long)cStack_a8.m_size;
  if (lVar10 == 0) {
    (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[0x1d])(this);
  }
  else {
    uVar2 = (this->m_primitive_manager).m_part;
    local_38 = 0x3c23d70a;
    while (bVar11 = lVar10 != 0, lVar10 = lVar10 + -1, bVar11) {
      iVar3 = cStack_a8.m_data[lVar10];
      iVar9 = (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape
                ._vptr_cbtCollisionShape[0x15])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x28))
                ((long *)CONCAT44(extraout_var,iVar9),iVar3,local_78);
      (*callback->_vptr_cbtTriangleCallback[2])
                (callback,local_78,(ulong)uVar2,(ulong)(uint)cStack_a8.m_data[lVar10]);
    }
    (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[0x1d])(this);
  }
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&cStack_a8);
  return;
}

Assistant:

void cbtGImpactMeshShapePart::processAllTrianglesRay(cbtTriangleCallback* callback, const cbtVector3& rayFrom, const cbtVector3& rayTo) const
{
	lockChildShapes();

	cbtAlignedObjectArray<int> collided;
	cbtVector3 rayDir(rayTo - rayFrom);
	rayDir.normalize();
	m_box_set.rayQuery(rayDir, rayFrom, collided);

	if (collided.size() == 0)
	{
		unlockChildShapes();
		return;
	}

	int part = (int)getPart();
	cbtPrimitiveTriangle triangle;
	int i = collided.size();
	while (i--)
	{
		getPrimitiveTriangle(collided[i], triangle);
		callback->processTriangle(triangle.m_vertices, part, collided[i]);
	}
	unlockChildShapes();
}